

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::HandleTransitionProperty(Element *this)

{
  PropertyId PVar1;
  pointer pTVar2;
  pointer pTVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer pAVar7;
  undefined8 uVar8;
  undefined3 uVar9;
  float fVar10;
  int iVar11;
  TransitionList *pTVar12;
  pointer pEVar13;
  long lVar14;
  long lVar15;
  pointer pTVar16;
  pointer pTVar17;
  pointer pAVar18;
  long lVar19;
  iterator __last;
  pointer pEVar20;
  pointer pEVar21;
  iterator iVar22;
  iterator __first;
  vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_> local_b8;
  pointer local_98;
  pointer pAStack_90;
  ElementAnimationList *local_80;
  long local_78;
  undefined5 uStack_70;
  undefined3 local_6b;
  undefined5 uStack_68;
  vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_> local_60;
  double local_48;
  undefined7 uStack_40;
  undefined4 uStack_39;
  
  if ((this->field_0x17 & 0x10) == 0) {
    return;
  }
  this->field_0x17 = this->field_0x17 & 0xef;
  pTVar12 = Style::ComputedValues::transition(&this->meta->computed_values);
  if (pTVar12 != (TransitionList *)0x0) {
    if (pTVar12->all != false) {
      return;
    }
    local_80 = &this->animations;
    if (pTVar12->none != true) {
      __first._M_current =
           (local_80->
           super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>).
           _M_impl.super__Vector_impl_data._M_start;
      pEVar20 = (this->animations).
                super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (__first._M_current != pEVar20) {
        do {
          while ((__first._M_current)->origin == Transition) {
            PVar1 = (__first._M_current)->property_id;
            pTVar2 = (pTVar12->transitions).
                     super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pTVar3 = (pTVar12->transitions).
                     super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            lVar14 = (long)pTVar3 - (long)pTVar2;
            lVar15 = (lVar14 >> 3) * -0x3333333333333333 >> 2;
            pTVar16 = pTVar2;
            lVar19 = lVar14;
            if (0 < lVar15) {
              pTVar16 = pTVar2 + lVar15 * 4;
              lVar19 = lVar15 + 1;
              pTVar17 = pTVar2 + 2;
              do {
                if (pTVar17[-2].id == PVar1) {
                  pTVar17 = pTVar17 + -2;
                  goto LAB_0021607b;
                }
                if (pTVar17[-1].id == PVar1) {
                  pTVar17 = pTVar17 + -1;
                  goto LAB_0021607b;
                }
                if (pTVar17->id == PVar1) goto LAB_0021607b;
                if (pTVar17[1].id == PVar1) {
                  pTVar17 = pTVar17 + 1;
                  goto LAB_0021607b;
                }
                lVar19 = lVar19 + -1;
                pTVar17 = pTVar17 + 4;
              } while (1 < lVar19);
              lVar19 = (long)pTVar3 - (long)pTVar16;
            }
            lVar19 = (lVar19 >> 3) * -0x3333333333333333;
            if (lVar19 == 1) {
LAB_0021605f:
              pTVar17 = pTVar16;
              if (pTVar16->id != PVar1) {
                pTVar17 = pTVar3;
              }
LAB_0021607b:
              if (pTVar17 != pTVar3) break;
            }
            else {
              if (lVar19 == 2) {
LAB_00216056:
                pTVar17 = pTVar16;
                if (pTVar16->id != PVar1) {
                  pTVar16 = pTVar16 + 1;
                  goto LAB_0021605f;
                }
                goto LAB_0021607b;
              }
              if (lVar19 == 3) {
                pTVar17 = pTVar16;
                if (pTVar16->id != PVar1) {
                  pTVar16 = pTVar16 + 1;
                  goto LAB_00216056;
                }
                goto LAB_0021607b;
              }
            }
            if (__first._M_current == pEVar20 + -1) goto LAB_00216422;
            local_78 = (long)pTVar3 - (long)(pTVar2 + lVar15 * 4);
            local_98 = (pointer)(lVar15 + 1);
            pEVar13 = pEVar20 + -1;
            pEVar21 = pEVar20;
            while (pEVar20 = pEVar13, pEVar21[-1].origin == Transition) {
              PVar1 = pEVar21[-1].property_id;
              lVar19 = lVar14;
              pAVar18 = local_98;
              pTVar16 = pTVar2;
              pTVar17 = pTVar2 + 2;
              if (0 < lVar15) {
                do {
                  if (pTVar17[-2].id == PVar1) {
                    pTVar17 = pTVar17 + -2;
                    goto LAB_0021616f;
                  }
                  if (pTVar17[-1].id == PVar1) {
                    pTVar17 = pTVar17 + -1;
                    goto LAB_0021616f;
                  }
                  if (pTVar17->id == PVar1) goto LAB_0021616f;
                  if (pTVar17[1].id == PVar1) {
                    pTVar17 = pTVar17 + 1;
                    goto LAB_0021616f;
                  }
                  pAVar18 = (pointer)((long)&pAVar18[-1].tween.callback + 7);
                  lVar19 = local_78;
                  pTVar16 = pTVar2 + lVar15 * 4;
                  pTVar17 = pTVar17 + 4;
                } while (1 < (long)pAVar18);
              }
              lVar19 = (lVar19 >> 3) * -0x3333333333333333;
              if (lVar19 == 1) {
LAB_00216156:
                pTVar17 = pTVar16;
                if (pTVar16->id != PVar1) {
                  pTVar17 = pTVar3;
                }
LAB_0021616f:
                if (pTVar17 != pTVar3) break;
              }
              else {
                if (lVar19 == 2) {
LAB_0021614d:
                  pTVar17 = pTVar16;
                  if (pTVar16->id != PVar1) {
                    pTVar16 = pTVar16 + 1;
                    goto LAB_00216156;
                  }
                  goto LAB_0021616f;
                }
                if (lVar19 == 3) {
                  pTVar17 = pTVar16;
                  if (pTVar16->id != PVar1) {
                    pTVar16 = pTVar16 + 1;
                    goto LAB_0021614d;
                  }
                  goto LAB_0021616f;
                }
              }
              pEVar13 = pEVar20 + -1;
              pEVar21 = pEVar20;
              if (__first._M_current == pEVar20 + -1) goto LAB_00216422;
            }
            uVar4._0_1_ = (__first._M_current)->property_id;
            uVar4._1_3_ = *(undefined3 *)&(__first._M_current)->field_0x1;
            uVar4._4_4_ = (__first._M_current)->duration;
            uStack_68 = (undefined5)
                        ((ulong)*(undefined8 *)((long)&(__first._M_current)->duration + 1) >> 0x18);
            uStack_70 = (undefined5)uVar4;
            local_6b = (undefined3)((uint)uVar4._4_4_ >> 8);
            pAVar18 = ((__first._M_current)->keys).
                      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_98 = ((__first._M_current)->keys).
                       super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pAStack_90 = ((__first._M_current)->keys).
                         super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
            ((__first._M_current)->keys).
            super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ((__first._M_current)->keys).
            super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            ((__first._M_current)->keys).
            super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48 = (__first._M_current)->last_update_world_time;
            uVar6._0_4_ = (__first._M_current)->time_since_iteration_start;
            uVar6._4_4_ = (__first._M_current)->current_iteration;
            uStack_40 = (undefined7)uVar6;
            uStack_39._1_3_ =
                 (undefined3)
                 ((uint)*(undefined4 *)((long)&(__first._M_current)->current_iteration + 3) >> 8);
            uStack_39._0_1_ = (undefined1)((uint)uVar6._4_4_ >> 0x18);
            uVar9 = *(undefined3 *)&pEVar20->field_0x1;
            fVar10 = pEVar20->duration;
            uVar5 = *(undefined8 *)((long)&pEVar20->duration + 1);
            (__first._M_current)->property_id = pEVar20->property_id;
            *(undefined3 *)&(__first._M_current)->field_0x1 = uVar9;
            (__first._M_current)->duration = fVar10;
            *(undefined8 *)((long)&(__first._M_current)->duration + 1) = uVar5;
            pAVar7 = pEVar21[-1].keys.
                     super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            ((__first._M_current)->keys).
            super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
            super__Vector_impl_data._M_start =
                 pEVar21[-1].keys.
                 super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                 super__Vector_impl_data._M_start;
            ((__first._M_current)->keys).
            super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
            super__Vector_impl_data._M_finish = pAVar7;
            ((__first._M_current)->keys).
            super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 pEVar21[-1].keys.
                 super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_b8.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_b8.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_b8.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            pEVar21[-1].keys.
            super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pEVar21[-1].keys.
            super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            pEVar21[-1].keys.
            super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_b8)
            ;
            *(undefined4 *)((long)&(__first._M_current)->current_iteration + 3) =
                 *(undefined4 *)((long)&pEVar21[-1].current_iteration + 3);
            fVar10 = pEVar21[-1].time_since_iteration_start;
            iVar11 = pEVar21[-1].current_iteration;
            (__first._M_current)->last_update_world_time = pEVar21[-1].last_update_world_time;
            (__first._M_current)->time_since_iteration_start = fVar10;
            (__first._M_current)->current_iteration = iVar11;
            *(ulong *)((long)&pEVar20->duration + 1) = CONCAT53(uStack_68,local_6b);
            pEVar20->property_id = (char)uStack_70;
            *(int3 *)&pEVar20->field_0x1 = (int3)((uint5)uStack_70 >> 8);
            pEVar20->duration = (float)(int)(CONCAT35(local_6b,uStack_70) >> 0x20);
            local_b8.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 pEVar21[-1].keys.
                 super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            pEVar21[-1].keys.
            super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = pAVar18;
            local_b8.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 pEVar21[-1].keys.
                 super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_b8.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 pEVar21[-1].keys.
                 super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            pEVar21[-1].keys.
            super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
            super__Vector_impl_data._M_start = local_98;
            pEVar21[-1].keys.
            super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
            super__Vector_impl_data._M_finish = pAStack_90;
            local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_b8)
            ;
            *(undefined4 *)((long)&pEVar21[-1].current_iteration + 3) = uStack_39;
            pEVar21[-1].last_update_world_time = local_48;
            pEVar21[-1].time_since_iteration_start = (float)(int)uStack_40;
            pEVar21[-1].current_iteration = (int)(CONCAT17((undefined1)uStack_39,uStack_40) >> 0x20)
            ;
            ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_60)
            ;
            __first._M_current = __first._M_current + 1;
            if (__first._M_current == pEVar20) goto LAB_00216422;
          }
          __first._M_current = __first._M_current + 1;
        } while (__first._M_current != pEVar20);
      }
      goto LAB_00216422;
    }
  }
  local_80 = &this->animations;
  __first._M_current =
       (local_80->super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>)
       ._M_impl.super__Vector_impl_data._M_start;
  pEVar20 = (this->animations).
            super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != pEVar20) {
    pEVar13 = __first._M_current;
    do {
      while (__first._M_current = pEVar13, (__first._M_current)->origin != Transition) {
        __first._M_current = __first._M_current + 1;
        pEVar13 = __first._M_current;
        if (__first._M_current == pEVar20) goto LAB_00216422;
      }
      do {
        pEVar13 = pEVar20;
        pEVar20 = pEVar13 + -1;
        if (pEVar20 == __first._M_current) goto LAB_00216422;
      } while (pEVar13[-1].origin == Transition);
      uVar5._0_1_ = (__first._M_current)->property_id;
      uVar5._1_3_ = *(undefined3 *)&(__first._M_current)->field_0x1;
      uVar5._4_4_ = (__first._M_current)->duration;
      uStack_68 = (undefined5)
                  ((ulong)*(undefined8 *)((long)&(__first._M_current)->duration + 1) >> 0x18);
      uStack_70 = (undefined5)uVar5;
      local_6b = (undefined3)((uint)uVar5._4_4_ >> 8);
      pAVar18 = ((__first._M_current)->keys).
                super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      local_98 = ((__first._M_current)->keys).
                 super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pAStack_90 = ((__first._M_current)->keys).
                   super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl
                   .super__Vector_impl_data._M_finish;
      ((__first._M_current)->keys).
      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ((__first._M_current)->keys).
      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((__first._M_current)->keys).
      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48 = (__first._M_current)->last_update_world_time;
      uVar8._0_4_ = (__first._M_current)->time_since_iteration_start;
      uVar8._4_4_ = (__first._M_current)->current_iteration;
      uStack_40 = (undefined7)uVar8;
      uStack_39._1_3_ =
           (undefined3)
           ((uint)*(undefined4 *)((long)&(__first._M_current)->current_iteration + 3) >> 8);
      uStack_39._0_1_ = (undefined1)((uint)uVar8._4_4_ >> 0x18);
      uVar9 = *(undefined3 *)&pEVar20->field_0x1;
      fVar10 = pEVar20->duration;
      uVar5 = *(undefined8 *)((long)&pEVar13[-1].duration + 1);
      (__first._M_current)->property_id = pEVar20->property_id;
      *(undefined3 *)&(__first._M_current)->field_0x1 = uVar9;
      (__first._M_current)->duration = fVar10;
      *(undefined8 *)((long)&(__first._M_current)->duration + 1) = uVar5;
      pAVar7 = pEVar13[-1].keys.
               super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ((__first._M_current)->keys).
      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_start =
           pEVar13[-1].keys.
           super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
           super__Vector_impl_data._M_start;
      ((__first._M_current)->keys).
      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_finish = pAVar7;
      ((__first._M_current)->keys).
      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           pEVar13[-1].keys.
           super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_b8.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pEVar13[-1].keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pEVar13[-1].keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pEVar13[-1].keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_b8);
      *(undefined4 *)((long)&(__first._M_current)->current_iteration + 3) =
           *(undefined4 *)((long)&pEVar13[-1].current_iteration + 3);
      fVar10 = pEVar13[-1].time_since_iteration_start;
      iVar11 = pEVar13[-1].current_iteration;
      (__first._M_current)->last_update_world_time = pEVar13[-1].last_update_world_time;
      (__first._M_current)->time_since_iteration_start = fVar10;
      (__first._M_current)->current_iteration = iVar11;
      pEVar20->property_id = (char)uStack_70;
      *(int3 *)&pEVar20->field_0x1 = (int3)((uint5)uStack_70 >> 8);
      pEVar20->duration = (float)(int)(CONCAT35(local_6b,uStack_70) >> 0x20);
      *(ulong *)((long)&pEVar13[-1].duration + 1) = CONCAT53(uStack_68,local_6b);
      local_b8.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           pEVar13[-1].keys.
           super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      pEVar13[-1].keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = pAVar18;
      local_b8.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_start =
           pEVar13[-1].keys.
           super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_b8.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_finish =
           pEVar13[-1].keys.
           super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pEVar13[-1].keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
      _M_impl.super__Vector_impl_data._M_start = local_98;
      pEVar13[-1].keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
      _M_impl.super__Vector_impl_data._M_finish = pAStack_90;
      local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_b8);
      *(undefined4 *)((long)&pEVar13[-1].current_iteration + 3) = uStack_39;
      pEVar13[-1].last_update_world_time = local_48;
      pEVar13[-1].time_since_iteration_start = (float)(int)uStack_40;
      pEVar13[-1].current_iteration = (int)(CONCAT17((undefined1)uStack_39,uStack_40) >> 0x20);
      ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_60);
      pEVar13 = __first._M_current + 1;
    } while (pEVar20 != __first._M_current + 1);
    __first._M_current = __first._M_current + 1;
  }
LAB_00216422:
  __last._M_current = __first._M_current;
  iVar22._M_current = __first._M_current;
  if (__first._M_current !=
      (this->animations).
      super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ElementStyle::RemoveProperty(&this->meta->style,(iVar22._M_current)->property_id);
      iVar22._M_current = iVar22._M_current + 1;
      __last._M_current = __last._M_current + 1;
    } while (iVar22._M_current !=
             (this->animations).
             super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::_M_erase
            (local_80,__first,__last);
  return;
}

Assistant:

void Element::HandleTransitionProperty()
{
	if (dirty_transition)
	{
		dirty_transition = false;

		// Remove all transitions that are no longer in our local list
		const TransitionList* keep_transitions = GetComputedValues().transition();

		if (keep_transitions && keep_transitions->all)
			return;

		auto it_remove = animations.end();

		if (!keep_transitions || keep_transitions->none)
		{
			// All transitions should be removed, but only touch the animations that originate from the 'transition' property.
			// Move all animations to be erased in a valid state at the end of the list, and erase later.
			it_remove = std::partition(animations.begin(), animations.end(),
				[](const ElementAnimation& animation) -> bool { return !animation.IsTransition(); });
		}
		else
		{
			RMLUI_ASSERT(keep_transitions);

			// Only remove the transitions that are not in our keep list.
			const auto& keep_transitions_list = keep_transitions->transitions;

			it_remove = std::partition(animations.begin(), animations.end(), [&keep_transitions_list](const ElementAnimation& animation) -> bool {
				if (!animation.IsTransition())
					return true;
				auto it = std::find_if(keep_transitions_list.begin(), keep_transitions_list.end(),
					[&animation](const Transition& transition) { return animation.GetPropertyId() == transition.id; });
				bool keep_animation = (it != keep_transitions_list.end());
				return keep_animation;
			});
		}

		// We can decide what to do with cancelled transitions here.
		for (auto it = it_remove; it != animations.end(); ++it)
			RemoveProperty(it->GetPropertyId());

		animations.erase(it_remove, animations.end());
	}
}